

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::MessageFullName_abi_cxx11_
          (string *__return_storage_ptr__,php *this,Descriptor *message,bool is_descriptor)

{
  string *psVar1;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  byte local_19;
  php *ppStack_18;
  bool is_descriptor_local;
  Descriptor *message_local;
  
  local_19 = (byte)message & 1;
  ppStack_18 = this;
  message_local = (Descriptor *)__return_storage_ptr__;
  if (((ulong)message & 1) == 0) {
    psVar1 = Descriptor::full_name_abi_cxx11_((Descriptor *)this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  }
  else {
    psVar1 = Descriptor::full_name_abi_cxx11_((Descriptor *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"google.protobuf",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"google.protobuf.internal",&local_79);
    StringReplace(__return_storage_ptr__,psVar1,&local_40,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageFullName(const Descriptor* message, bool is_descriptor) {
  if (is_descriptor) {
    return StringReplace(message->full_name(),
                         "google.protobuf",
                         "google.protobuf.internal", false);
  } else {
    return message->full_name();
  }
}